

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O0

void Extra_StringClean(char *pStrGiven,char *pCharKeep)

{
  char *local_30;
  char *pSave;
  char *pChar;
  char *pTemp;
  char *pCharKeep_local;
  char *pStrGiven_local;
  
  local_30 = pStrGiven;
  for (pChar = pStrGiven; pSave = pCharKeep, *pChar != '\0'; pChar = pChar + 1) {
    for (; (*pSave != '\0' && (*pChar != *pSave)); pSave = pSave + 1) {
    }
    if (*pSave != '\0') {
      *local_30 = *pChar;
      local_30 = local_30 + 1;
    }
  }
  *local_30 = '\0';
  return;
}

Assistant:

void Extra_StringClean( char * pStrGiven, char * pCharKeep )
{
    char * pTemp, * pChar, * pSave = pStrGiven;
    for ( pTemp = pStrGiven; *pTemp; pTemp++ )
    {
        for ( pChar = pCharKeep; *pChar; pChar++ )
            if ( *pTemp == *pChar )
                break;
        if ( *pChar == 0 )
            continue;
        *pSave++ = *pTemp;
    }
    *pSave = 0;
}